

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

void __thiscall mocker::ir::Builder::operator()(Builder *this,BoolLitExpr *node)

{
  BuilderContext *this_00;
  NodeID id;
  shared_ptr<mocker::ir::IntLiteral> local_38;
  shared_ptr<mocker::ir::Addr> local_28;
  BoolLitExpr *local_18;
  BoolLitExpr *node_local;
  Builder *this_local;
  
  this_00 = this->ctx;
  local_18 = node;
  node_local = (BoolLitExpr *)this;
  id = ast::ASTNode::getID((ASTNode *)node);
  std::make_shared<mocker::ir::IntLiteral,long>((long *)&local_38);
  std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::IntLiteral,void>(&local_28,&local_38);
  BuilderContext::setExprAddr(this_00,id,&local_28);
  std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_28);
  std::shared_ptr<mocker::ir::IntLiteral>::~shared_ptr(&local_38);
  BuilderContext::markExprTrivial(this->ctx,(Expression *)local_18);
  BuilderContext::checkLogicalExpr(this->ctx,(Expression *)local_18);
  return;
}

Assistant:

void Builder::operator()(const ast::BoolLitExpr &node) const {
  ctx.setExprAddr(node.getID(),
                  std::make_shared<IntLiteral>((Integer)node.val));
  ctx.markExprTrivial(node);
  ctx.checkLogicalExpr(node);
}